

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::insert
          (SerialArenaChunk *this,void *me,SerialArena *serial)

{
  atomic<unsigned_int> *paVar1;
  uint32_t i;
  uint32_t uVar2;
  uint32_t uVar3;
  SerialArenaChunkHeader *pSVar4;
  atomic<void_*> *paVar5;
  atomic<google::protobuf::internal::SerialArena_*> *paVar6;
  
  pSVar4 = header(this);
  LOCK();
  paVar1 = &pSVar4->size;
  i = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  uVar2 = capacity(this);
  if (i < uVar2) {
    paVar5 = id(this,i);
    (paVar5->_M_b)._M_p = me;
    paVar6 = arena(this,i);
    (paVar6->_M_b)._M_p = serial;
  }
  else {
    pSVar4 = header(this);
    uVar3 = capacity(this);
    (pSVar4->size).super___atomic_base<unsigned_int>._M_i = uVar3;
  }
  return i < uVar2;
}

Assistant:

bool insert(void* me, SerialArena* serial) {
    uint32_t idx = size().fetch_add(1, std::memory_order_relaxed);
    // Bail out if this chunk is full.
    if (idx >= capacity()) {
      // Write old value back to avoid potential overflow.
      size().store(capacity(), std::memory_order_relaxed);
      return false;
    }

    id(idx).store(me, std::memory_order_relaxed);
    arena(idx).store(serial, std::memory_order_release);
    return true;
  }